

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_optional<unsigned_long>
          (Parser *this,string *name,string *alternative,unsigned_long defaultValue,
          string *description)

{
  CmdArgument<unsigned_long> *this_00;
  CmdArgument<unsigned_long> *local_50 [3];
  CmdArgument<unsigned_long> *local_38;
  CmdArgument<unsigned_long> *command;
  string *description_local;
  unsigned_long defaultValue_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command = (CmdArgument<unsigned_long> *)description;
  description_local = (string *)defaultValue;
  defaultValue_local = (unsigned_long)alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdArgument<unsigned_long> *)operator_new(0xb0);
  CmdArgument<unsigned_long>::CmdArgument
            (this_00,alternative_local,(string *)defaultValue_local,(string *)command,false);
  this_00->value = (unsigned_long)description_local;
  local_50[0] = this_00;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_50);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "") {
			auto command = new CmdArgument<T> { name, alternative, description, false };
			command->value = defaultValue;
			_commands.push_back(command);
		}